

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_preview.cpp
# Opt level: O3

void __thiscall QPreviewPaintEngine::abort(QPreviewPaintEngine *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  
  lVar1 = *(long *)&this->field_0x18;
  (**(code **)(*(long *)this + 0x18))();
  lVar2 = *(long *)(lVar1 + 0xb0);
  if (lVar2 != 0) {
    lVar3 = *(long *)(lVar1 + 0xa8);
    lVar5 = 0;
    do {
      plVar4 = *(long **)(lVar3 + lVar5);
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 8))();
      }
      lVar5 = lVar5 + 8;
    } while (lVar2 << 3 != lVar5);
  }
  *(undefined4 *)(lVar1 + 200) = 2;
  return;
}

Assistant:

bool QPreviewPaintEngine::abort()
{
    Q_D(QPreviewPaintEngine);
    end();
    qDeleteAll(d->pages);
    d->state = QPrinter::Aborted;

    return true;
}